

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzysmp.cpp
# Opt level: O3

void __thiscall
TPZFYsmpMatrix<std::complex<float>_>::TPZFYsmpMatrix
          (TPZFYsmpMatrix<std::complex<float>_> *this,int64_t rows,int64_t cols)

{
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow = rows;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol = cols;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFYsmpMatrix_01875870;
  (this->fIA)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
  (this->fIA).fStore = (long *)0x0;
  (this->fIA).fNElements = 0;
  (this->fIA).fNAlloc = 0;
  (this->fJA)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
  (this->fJA).fStore = (long *)0x0;
  (this->fJA).fNElements = 0;
  (this->fJA).fNAlloc = 0;
  (this->fA)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181a968;
  (this->fA).fStore = (complex<float> *)0x0;
  (this->fA).fNElements = 0;
  (this->fA).fNAlloc = 0;
  (this->fDiag)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181a968;
  (this->fDiag).fStore = (complex<float> *)0x0;
  (this->fDiag).fNElements = 0;
  (this->fDiag).fNAlloc = 0;
  TPZPardisoSolver<std::complex<float>_>::TPZPardisoSolver(&this->fPardisoControl);
  this->fSymmetric = 0;
  return;
}

Assistant:

TPZFYsmpMatrix<TVar>::TPZFYsmpMatrix(const int64_t rows,const int64_t cols ) :
TPZRegisterClassId(&TPZFYsmpMatrix::ClassId),TPZMatrix<TVar>(rows,cols) {
	// Constructs an empty TPZFYsmpMatrix
	//    fSolver = -1;
	fSymmetric = 0;
	//    fMaxIterations = 4;
	//    fSORRelaxation = 1.;
#ifdef CONSTRUCTOR
	cerr << "TPZFYsmpMatrix(int rows,int cols)\n";
#endif
}